

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pingpong_test.c
# Opt level: O3

void mutex_cv_ping_pong(ping_pong *pp,int parity)

{
  undefined1 auVar1 [16];
  int iVar2;
  uint uVar3;
  nsync *this;
  ulong uVar4;
  undefined4 in_stack_ffffffffffffffb0;
  
  uVar4 = (ulong)(uint)parity;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)pp->mutex);
  if (iVar2 == 0) {
    uVar3 = pp->i;
    if ((int)uVar3 < pp->limit) {
      this = (nsync *)(pp->cv + uVar4);
      iVar2 = 1 - parity;
      do {
        if ((uVar3 & 1) == (uint)uVar4) {
          do {
            auVar1._4_4_ = parity;
            auVar1._0_4_ = in_stack_ffffffffffffffb0;
            auVar1._8_8_ = 0;
            nsync::nsync_cv_wait_with_deadline_generic
                      (this,(nsync_cv *)&pp->mutex,void_pthread_mutex_lock,void_pthread_mutex_unlock
                       ,(_func_void_void_ptr *)0x7fffffffffffffff,(nsync_time)(auVar1 << 0x40),
                       (nsync_note)0x3b9ac9ff);
            uVar3 = pp->i;
          } while ((uVar3 & 1) == parity);
        }
        pp->i = uVar3 + 1;
        nsync::nsync_cv_signal(pp->cv + iVar2);
        uVar3 = pp->i;
        uVar4 = (ulong)(uint)parity;
      } while ((int)uVar3 < pp->limit);
    }
    pthread_mutex_unlock((pthread_mutex_t *)pp->mutex);
    ping_pong_done(pp);
    return;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

static void mutex_cv_ping_pong (ping_pong *pp, int parity) {
	pthread_mutex_lock (&pp->mutex);
	while (pp->i < pp->limit) {
		while ((pp->i & 1) == parity) {
			nsync_cv_wait_with_deadline_generic (&pp->cv[parity], &pp->mutex,
						             &void_pthread_mutex_lock,
						             &void_pthread_mutex_unlock,
						             nsync_time_no_deadline, NULL);
		}
		pp->i++;
		nsync_cv_signal (&pp->cv[1-parity]);
	}

	pthread_mutex_unlock (&pp->mutex);
	ping_pong_done (pp);
}